

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void triangle(array<vec<3UL,_int>,_3UL> pts,vector<double,_std::allocator<double>_> *zbuffer,
             TGAImage *image,TGAColor color)

{
  vec3i P_00;
  vec3i A;
  vec3i B;
  vec3i C;
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  reference pvVar6;
  int *piVar7;
  int *__b;
  double *pdVar8;
  reference pvVar9;
  double dVar10;
  int local_c4;
  int i_1;
  undefined1 local_68 [8];
  vec3f bc_screen;
  vec3i P;
  int local_3c;
  int j;
  int i;
  vec2i clamp;
  vec2i bboxmax;
  vec2i bboxmin;
  TGAImage *image_local;
  vector<double,_std::allocator<double>_> *zbuffer_local;
  TGAColor color_local;
  
  zbuffer_local._3_4_ = color.bgra;
  zbuffer_local._7_1_ = color.bytespp;
  iVar1 = std::numeric_limits<int>::max();
  iVar2 = std::numeric_limits<int>::max();
  vec<2UL,_int>::vec(&bboxmax,iVar1,iVar2);
  iVar1 = std::numeric_limits<int>::min();
  iVar2 = std::numeric_limits<int>::min();
  vec<2UL,_int>::vec(&clamp,iVar1,iVar2);
  sVar3 = TGAImage::get_width(image);
  sVar4 = TGAImage::get_height(image);
  vec<2UL,_int>::vec((vec<2UL,_int> *)&j,(int)sVar3 + -1,(int)sVar4 + -1);
  for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
    for (P.z = 0; P.z < 2; P.z = P.z + 1) {
      P.y = 0;
      piVar5 = vec<2UL,_int>::operator[](&bboxmax,(long)P.z);
      pvVar6 = std::array<vec<3UL,_int>,_3UL>::operator[](&pts,(long)local_3c);
      piVar7 = vec<3UL,_int>::operator[](pvVar6,(long)P.z);
      piVar5 = std::min<int>(piVar5,piVar7);
      piVar5 = std::max<int>(&P.y,piVar5);
      iVar1 = *piVar5;
      piVar5 = vec<2UL,_int>::operator[](&bboxmax,(long)P.z);
      *piVar5 = iVar1;
      piVar5 = vec<2UL,_int>::operator[]((vec<2UL,_int> *)&j,(long)P.z);
      piVar7 = vec<2UL,_int>::operator[](&clamp,(long)P.z);
      pvVar6 = std::array<vec<3UL,_int>,_3UL>::operator[](&pts,(long)local_3c);
      __b = vec<3UL,_int>::operator[](pvVar6,(long)P.z);
      piVar7 = std::max<int>(piVar7,__b);
      piVar5 = std::min<int>(piVar5,piVar7);
      iVar1 = *piVar5;
      piVar5 = vec<2UL,_int>::operator[](&clamp,(long)P.z);
      *piVar5 = iVar1;
    }
  }
  vec<3UL,_int>::vec((vec<3UL,_int> *)&bc_screen.z);
  for (bc_screen.z._0_4_ = bboxmax.x; bc_screen.z._0_4_ <= clamp.x;
      bc_screen.z._0_4_ = bc_screen.z._0_4_ + 1) {
    for (bc_screen.z._4_4_ = bboxmax.y; bc_screen.z._4_4_ <= clamp.y;
        bc_screen.z._4_4_ = bc_screen.z._4_4_ + 1) {
      pvVar6 = std::array<vec<3UL,_int>,_3UL>::operator[](&pts,0);
      A.x = pvVar6->x;
      A.y = pvVar6->y;
      A.z = pvVar6->z;
      pvVar6 = std::array<vec<3UL,_int>,_3UL>::operator[](&pts,1);
      B.x = pvVar6->x;
      B.y = pvVar6->y;
      B.z = pvVar6->z;
      pvVar6 = std::array<vec<3UL,_int>,_3UL>::operator[](&pts,2);
      C.x = pvVar6->x;
      C.y = pvVar6->y;
      C.z = pvVar6->z;
      P_00.y = bc_screen.z._4_4_;
      P_00.x = bc_screen.z._0_4_;
      P_00.z = P.x;
      barycentric((vec3f *)local_68,A,B,C,P_00);
      if (((0.0 <= (double)local_68) && (0.0 <= bc_screen.x)) && (0.0 <= bc_screen.y)) {
        P.x = 0;
        for (local_c4 = 0; local_c4 < 3; local_c4 = local_c4 + 1) {
          pvVar6 = std::array<vec<3UL,_int>,_3UL>::operator[](&pts,(long)local_c4);
          piVar5 = vec<3UL,_int>::operator[](pvVar6,2);
          iVar1 = *piVar5;
          pdVar8 = vec<3UL,_double>::operator[]((vec<3UL,_double> *)local_68,(long)local_c4);
          P.x = iVar1 * (int)*pdVar8 + P.x;
        }
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           (zbuffer,(long)(bc_screen.z._0_4_ + bc_screen.z._4_4_ * 600));
        if (*pvVar9 < (double)P.x) {
          dVar10 = (double)P.x;
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             (zbuffer,(long)(bc_screen.z._0_4_ + bc_screen.z._4_4_ * 600));
          *pvVar9 = dVar10;
          TGAImage::set(image,(long)bc_screen.z._0_4_,(long)bc_screen.z._4_4_,
                        (TGAColor *)((long)&zbuffer_local + 3));
        }
      }
    }
  }
  return;
}

Assistant:

void triangle(std::array<vec3i, 3> pts, std::vector<double> &zbuffer, TGAImage &image,
              TGAColor color)
{
    vec2i bboxmin(std::numeric_limits<int>::max(), std::numeric_limits<int>::max());
    vec2i bboxmax(std::numeric_limits<int>::min(), std::numeric_limits<int>::min());
    vec2i clamp(image.get_width() - 1, image.get_height() - 1);
    for (int i = 0; i < 3; i++) {
        for (int j = 0; j < 2; j++) {
            bboxmin[j] = std::max(0, std::min(bboxmin[j], pts[i][j]));
            bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
        }
    }
    vec3i P;
    for (P.x = bboxmin.x; P.x <= bboxmax.x; P.x++) {
        for (P.y = bboxmin.y; P.y <= bboxmax.y; P.y++) {
            vec3f bc_screen = barycentric(pts[0], pts[1], pts[2], P);
            if (bc_screen.x < 0 || bc_screen.y < 0 || bc_screen.z < 0) continue;
            P.z = 0;
            for (int i = 0; i < 3; i++) P.z += pts[i][2] * static_cast<int>(bc_screen[i]);
            if (zbuffer[int(P.x + P.y * width)] < P.z) {
                zbuffer[int(P.x + P.y * width)] = P.z;
                image.set(static_cast<int>(P.x), static_cast<int>(P.y), color);
            }
        }
    }
}